

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SignalEventControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
          (BumpAllocator *this,EdgeKind *args,Expression *args_1,Expression **args_2,
          SourceRange *args_3)

{
  SignalEventControl *this_00;
  SourceRange *args_local_3;
  Expression **args_local_2;
  Expression *args_local_1;
  EdgeKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SignalEventControl *)allocate(this,0x38,8);
  ast::SignalEventControl::SignalEventControl(this_00,*args,args_1,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }